

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader.cpp
# Opt level: O3

void __thiscall stackjit::Loader::Class::Class(Class *this,string *name)

{
  pointer pcVar1;
  
  (this->mName)._M_dataplus._M_p = (pointer)&(this->mName).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  (this->mFields).
  super__Vector_base<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mFields).
  super__Vector_base<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mFields).
  super__Vector_base<stackjit::Loader::Field,_std::allocator<stackjit::Loader::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mParentClassName)._M_dataplus._M_p = (pointer)&(this->mParentClassName).field_2;
  (this->mParentClassName)._M_string_length = 0;
  (this->mParentClassName).field_2._M_local_buf[0] = '\0';
  (this->mAttributes)._M_h._M_buckets = &(this->mAttributes)._M_h._M_single_bucket;
  (this->mAttributes)._M_h._M_bucket_count = 1;
  (this->mAttributes)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->mAttributes)._M_h._M_element_count = 0;
  (this->mAttributes)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->mAttributes)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->mAttributes)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Loader::Class::Class(std::string name)
		: mName(name) {

	}